

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void Glucose_SolveCnf(char *pFileName,Glucose_Pars *pPars)

{
  bool bVar1;
  uint uVar2;
  abctime aVar3;
  char *local_658;
  char *local_648;
  int64_t local_618;
  lbool local_60b;
  lbool local_60a;
  lbool local_609;
  undefined1 local_608 [7];
  lbool ret;
  vec<Gluco::Lit> dummy;
  undefined1 local_5e8 [8];
  SimpSolver S;
  abctime clk;
  Glucose_Pars *pPars_local;
  char *pFileName_local;
  
  S._1472_8_ = Abc_Clock();
  Gluco::SimpSolver::SimpSolver((SimpSolver *)local_5e8);
  S.super_Solver.conflict.sz = pPars->verb;
  if (pPars->nConfls < 1) {
    local_618 = -1;
  }
  else {
    local_618 = (int64_t)pPars->nConfls;
  }
  Gluco::Solver::setConfBudget((Solver *)local_5e8,local_618);
  Glucose_ReadDimacs(pFileName,(SimpSolver *)local_5e8);
  if (pPars->verb != 0) {
    printf("c ============================[ Problem Statistics ]=============================\n");
    printf("c |                                                                             |\n");
    uVar2 = Gluco::Solver::nVars((Solver *)local_5e8);
    printf("c |  Number of variables:  %12d                                         |\n",
           (ulong)uVar2);
    uVar2 = Gluco::Solver::nClauses((Solver *)local_5e8);
    printf("c |  Number of clauses:    %12d                                         |\n",
           (ulong)uVar2);
  }
  if (pPars->pre != 0) {
    Gluco::SimpSolver::eliminate((SimpSolver *)local_5e8,true);
    printf("c Simplication removed %d variables and %d clauses.  ",(ulong)(uint)S.merges,
           (ulong)(uint)S.asymm_lits);
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar3 - S._1472_8_);
  }
  Gluco::vec<Gluco::Lit>::vec((vec<Gluco::Lit> *)local_608);
  local_609 = Gluco::SimpSolver::solveLimited
                        ((SimpSolver *)local_5e8,(vec<Gluco::Lit> *)local_608,false,false);
  if (pPars->verb != 0) {
    aVar3 = Abc_Clock();
    glucose_print_stats((SimpSolver *)local_5e8,aVar3 - S._1472_8_);
  }
  Gluco::lbool::lbool(&local_60a,'\0');
  bVar1 = Gluco::lbool::operator==(&local_609,local_60a);
  if (bVar1) {
    local_648 = "SATISFIABLE";
  }
  else {
    Gluco::lbool::lbool(&local_60b,'\x01');
    bVar1 = Gluco::lbool::operator==(&local_609,local_60b);
    if (bVar1) {
      local_658 = "UNSATISFIABLE";
    }
    else {
      local_658 = "INDETERMINATE";
    }
    local_648 = local_658;
  }
  printf(local_648);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"      Time",aVar3 - S._1472_8_);
  Gluco::vec<Gluco::Lit>::~vec((vec<Gluco::Lit> *)local_608);
  Gluco::SimpSolver::~SimpSolver((SimpSolver *)local_5e8);
  return;
}

Assistant:

void Glucose_SolveCnf( char * pFileName, Glucose_Pars * pPars )
{
    abctime clk = Abc_Clock();

    SimpSolver  S;
    S.verbosity = pPars->verb;
    S.setConfBudget( pPars->nConfls > 0 ? (int64_t)pPars->nConfls : -1 );

//    gzFile in = gzopen(pFilename, "rb");
//    parse_DIMACS(in, S);
//    gzclose(in);
    Glucose_ReadDimacs( pFileName, S );

    if ( pPars->verb )
    {
        printf("c ============================[ Problem Statistics ]=============================\n");
        printf("c |                                                                             |\n");
        printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
        printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
    }
    
    if ( pPars->pre ) 
    {
        S.eliminate(true);
        printf( "c Simplication removed %d variables and %d clauses.  ", S.eliminated_vars, S.eliminated_clauses );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    vec<Lit> dummy;
    lbool ret = S.solveLimited(dummy, 0);
    if ( pPars->verb ) glucose_print_stats(S, Abc_Clock() - clk);
    printf(ret == l_True ? "SATISFIABLE" : ret == l_False ? "UNSATISFIABLE" : "INDETERMINATE");
    Abc_PrintTime( 1, "      Time", Abc_Clock() - clk );
}